

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::
MessageDifferencerTest_PartialEquivalencyTestSkipRequiredField_Test::TestBody
          (MessageDifferencerTest_PartialEquivalencyTestSkipRequiredField_Test *this)

{
  char *in_R9;
  TestRequired msg1;
  MessageDifferencer differencer;
  AssertHelper local_350;
  Message local_348;
  internal local_340 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_338;
  string local_330;
  TestRequired local_310;
  TestRequired local_268;
  MessageDifferencer local_1c0;
  
  proto2_unittest::TestRequired::TestRequired(&local_268,(Arena *)0x0);
  proto2_unittest::TestRequired::TestRequired(&local_310,(Arena *)0x0);
  local_268.field_0._impl_.a_ = 0x191;
  local_268.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_268.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 1;
  local_310.field_0._impl_.a_ = 0x191;
  local_310.field_0._impl_.b_ = 0x192;
  local_310.field_0._impl_._has_bits_.has_bits_[0]._0_1_ =
       local_310.field_0._impl_._has_bits_.has_bits_[0]._0_1_ | 5;
  util::MessageDifferencer::MessageDifferencer(&local_1c0);
  util::MessageDifferencer::set_message_field_comparison(&local_1c0,EQUIVALENT);
  util::MessageDifferencer::set_scope(&local_1c0,PARTIAL);
  local_340[0] = (internal)
                 util::MessageDifferencer::Compare
                           (&local_1c0,&local_268.super_Message,&local_310.super_Message);
  local_338 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_340[0]) {
    testing::Message::Message(&local_348);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_330,local_340,(AssertionResult *)0x122213d,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_350,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x336,local_330._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_350,&local_348);
    testing::internal::AssertHelper::~AssertHelper(&local_350);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_330._M_dataplus._M_p != &local_330.field_2) {
      operator_delete(local_330._M_dataplus._M_p,local_330.field_2._M_allocated_capacity + 1);
    }
    if (local_348.ss_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
         )0x0) {
      (**(code **)(*(long *)local_348.ss_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
    if (local_338 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_338,local_338);
    }
  }
  util::MessageDifferencer::~MessageDifferencer(&local_1c0);
  proto2_unittest::TestRequired::~TestRequired(&local_310);
  proto2_unittest::TestRequired::~TestRequired(&local_268);
  return;
}

Assistant:

TEST(MessageDifferencerTest, PartialEquivalencyTestSkipRequiredField) {
  // Create the testing protos
  unittest::TestRequired msg1;
  unittest::TestRequired msg2;

  msg1.set_a(401);
  msg2.set_a(401);
  msg2.set_b(402);

  // Compare
  util::MessageDifferencer differencer;
  differencer.set_message_field_comparison(
      util::MessageDifferencer::EQUIVALENT);
  differencer.set_scope(util::MessageDifferencer::PARTIAL);
  EXPECT_TRUE(differencer.Compare(msg1, msg2));
}